

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O3

Fraction operator*(Fraction *a,int *b)

{
  Fraction FVar1;
  uint uVar2;
  uint __n;
  uint uVar3;
  uint uVar4;
  
  FVar1 = *a;
  uVar4 = *b * FVar1.numerator_;
  uVar3 = uVar4;
  if ((int)uVar4 < 1) {
    uVar3 = -uVar4;
  }
  uVar2 = -uVar4;
  __n = -FVar1.denominator_;
  if (-1 < (long)FVar1) {
    uVar2 = uVar4;
    __n = FVar1.denominator_;
  }
  uVar3 = std::__detail::__gcd<unsigned_int>(uVar3,__n);
  return (Fraction)
         ((long)(int)__n / (long)(int)uVar3 << 0x20 |
         (long)(int)uVar2 / (long)(int)uVar3 & 0xffffffffU);
}

Assistant:

Fraction operator*(const Fraction& a, const int& b) {
  Fraction current_frac = a;
  current_frac.numerator_ *= b;
  current_frac.Normalization();
  return current_frac;
}